

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiTextFilter::Build(ImGuiTextFilter *this)

{
  int *piVar1;
  TextRange *pTVar2;
  char *pcVar3;
  TextRange *pTVar4;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  TextRange input_range;
  TextRange local_38;
  
  iVar8 = (this->Filters).Capacity;
  if (iVar8 < 0) {
    uVar7 = iVar8 / 2 + iVar8;
    uVar6 = 0;
    if (0 < (int)uVar7) {
      uVar6 = (ulong)uVar7;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    pTVar4 = (TextRange *)(*GImAllocatorAllocFunc)(uVar6 << 4,GImAllocatorUserData);
    pTVar2 = (this->Filters).Data;
    if (pTVar2 != (TextRange *)0x0) {
      memcpy(pTVar4,pTVar2,(long)(this->Filters).Size << 4);
      pTVar2 = (this->Filters).Data;
      if ((pTVar2 != (TextRange *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pTVar2,GImAllocatorUserData);
    }
    (this->Filters).Data = pTVar4;
    (this->Filters).Capacity = (int)uVar6;
  }
  (this->Filters).Size = 0;
  sVar5 = strlen(this->InputBuf);
  local_38.e = this->InputBuf + sVar5;
  local_38.b = this->InputBuf;
  TextRange::split(&local_38,',',&this->Filters);
  this->CountGrep = 0;
  uVar6 = (ulong)(uint)(this->Filters).Size;
  if (uVar6 != 0) {
    iVar8 = this->CountGrep;
    pTVar2 = (this->Filters).Data;
    uVar9 = 0;
    do {
      pTVar4 = pTVar2 + uVar9;
      pcVar10 = pTVar2[uVar9].b;
      if (pcVar10 < pTVar2[uVar9].e) {
        do {
          if ((*pcVar10 != ' ') && (*pcVar10 != '\t')) break;
          pcVar10 = pcVar10 + 1;
          pTVar4->b = pcVar10;
        } while (pcVar10 != pTVar2[uVar9].e);
      }
      pcVar3 = pTVar4->e;
      while (pcVar10 < pcVar3) {
        pcVar11 = pcVar3 + -1;
        if ((*pcVar11 != ' ') && (*pcVar11 != '\t')) break;
        pTVar4->e = pcVar11;
        pcVar3 = pcVar11;
      }
      if ((pcVar10 != pcVar3) && (*pcVar10 != '-')) {
        iVar8 = iVar8 + 1;
        this->CountGrep = iVar8;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar6);
  }
  return;
}

Assistant:

void ImGuiTextFilter::Build()
{
    Filters.resize(0);
    TextRange input_range(InputBuf, InputBuf+strlen(InputBuf));
    input_range.split(',', &Filters);

    CountGrep = 0;
    for (int i = 0; i != Filters.Size; i++)
    {
        TextRange& f = Filters[i];
        while (f.b < f.e && ImCharIsBlankA(f.b[0]))
            f.b++;
        while (f.e > f.b && ImCharIsBlankA(f.e[-1]))
            f.e--;
        if (f.empty())
            continue;
        if (Filters[i].b[0] != '-')
            CountGrep += 1;
    }
}